

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHelper.h
# Opt level: O2

void __thiscall
FIX::ExceptionMessageStoreFactory::ExceptionMessageStoreFactory
          (ExceptionMessageStoreFactory *this,SessionSettings *settings)

{
  (this->super_MessageStoreFactory)._vptr_MessageStoreFactory =
       (_func_int **)&PTR__ExceptionMessageStoreFactory_002fd780;
  (this->m_path)._M_dataplus._M_p = (pointer)&(this->m_path).field_2;
  (this->m_path)._M_string_length = 0;
  (this->m_path).field_2._M_local_buf[0] = '\0';
  SessionSettings::SessionSettings(&this->m_settings,settings);
  return;
}

Assistant:

ExceptionMessageStoreFactory(const SessionSettings &settings)
      : m_settings(settings) {}